

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_LoudnessMeter.cpp
# Opt level: O2

int LoudnessMeter::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  EffectData *pEVar1;
  bool bVar2;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<LoudnessMeter::EffectData>(state);
  memcpy(outbuffer,inbuffer,(ulong)length * (long)inchannels * 4);
  while (bVar2 = length != 0, length = length - 1, bVar2) {
    LoudnessAnalyzer::Feed(&pEVar1->momentary,inbuffer,inchannels);
    LoudnessAnalyzer::Feed(&pEVar1->shortterm,inbuffer,inchannels);
    LoudnessAnalyzer::Feed(&pEVar1->integrated,inbuffer,inchannels);
    inbuffer = inbuffer + inchannels;
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        memcpy(outbuffer, inbuffer, sizeof(float) * length * inchannels);

        const float* src = inbuffer;
        for (unsigned int n = 0; n < length; n++)
        {
            data->momentary.Feed(src, inchannels);
            data->shortterm.Feed(src, inchannels);
            data->integrated.Feed(src, inchannels);
            src += inchannels;
        }

        return UNITY_AUDIODSP_OK;
    }